

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O3

int __thiscall lzham::search_accelerator::init(search_accelerator *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint in_ECX;
  task_pool *in_RDX;
  size_t __n;
  uint uVar2;
  uint in_R8D;
  uint in_R9D;
  undefined8 unaff_R15;
  bool in_stack_00000008;
  uint in_stack_00000010;
  
  uVar2 = 0x80;
  if (in_stack_00000010 < 0x80) {
    uVar2 = in_stack_00000010;
  }
  this->m_max_probes = uVar2;
  this->m_pLZBase = (CLZBase *)ctx;
  if (in_ECX == 0) {
    in_RDX = (task_pool *)0x0;
  }
  this->m_pTask_pool = in_RDX;
  if (in_RDX == (task_pool *)0x0) {
    in_ECX = 0;
  }
  this->m_max_helper_threads = in_ECX;
  if (in_R9D <= uVar2) {
    uVar2 = in_R9D;
  }
  this->m_max_matches = uVar2;
  this->m_all_matches = in_stack_00000008;
  this->m_max_dict_size = in_R8D;
  this->m_max_dict_size_mask = in_R8D - 1;
  this->m_cur_dict_size = 0;
  this->m_lookahead_pos = 0;
  this->m_lookahead_size = 0;
  this->m_fill_lookahead_pos = 0;
  this->m_fill_lookahead_size = 0;
  this->m_fill_dict_size = 0;
  this->m_num_completed_helper_threads = 0;
  uVar2 = in_R8D + 0x101;
  if ((this->m_dict).m_capacity < uVar2) {
    unaff_R15 = 0;
    bVar1 = elemental_vector::increase_capacity
                      ((elemental_vector *)&this->m_dict,uVar2,
                       (this->m_dict).m_size == in_R8D + 0x100,1,(object_mover)0x0,true);
    if (!bVar1) {
      return 0;
    }
  }
  (this->m_dict).m_size = uVar2;
  if ((this->m_hash).m_capacity < 0x10000) {
    unaff_R15 = 0;
    bVar1 = elemental_vector::increase_capacity
                      ((elemental_vector *)&this->m_hash,0x10000,(this->m_hash).m_size == 0xffff,4,
                       (object_mover)0x0,true);
    if (!bVar1) {
      return 0;
    }
  }
  (this->m_hash).m_size = 0x10000;
  __n = 0x40000;
  if ((this->m_nodes).m_capacity < in_R8D) {
    unaff_R15 = 0;
    bVar1 = elemental_vector::increase_capacity
                      ((elemental_vector *)&this->m_nodes,in_R8D,
                       (this->m_nodes).m_size + 1 == in_R8D,8,(object_mover)0x0,true);
    if (!bVar1) {
      return 0;
    }
    __n = (size_t)((this->m_hash).m_size << 2);
  }
  (this->m_nodes).m_size = in_R8D;
  memset((this->m_hash).m_p,0,__n);
  return (int)CONCAT71((int7)((ulong)unaff_R15 >> 8),1);
}

Assistant:

bool search_accelerator::init(CLZBase* pLZBase, task_pool* pPool, uint max_helper_threads, uint max_dict_size, uint max_matches, bool all_matches, uint max_probes)
   {
      LZHAM_ASSERT(pLZBase);
      LZHAM_ASSERT(max_dict_size && math::is_power_of_2(max_dict_size));
      LZHAM_ASSERT(max_probes);

      m_max_probes = LZHAM_MIN(cMatchAccelMaxSupportedProbes, max_probes);

      m_pLZBase = pLZBase;
      m_pTask_pool = max_helper_threads ? pPool : NULL;
      m_max_helper_threads = m_pTask_pool ? max_helper_threads : 0;
      m_max_matches = LZHAM_MIN(m_max_probes, max_matches);
      m_all_matches = all_matches;

      m_max_dict_size = max_dict_size;
      m_max_dict_size_mask = m_max_dict_size - 1;
      m_cur_dict_size = 0;
      m_lookahead_size = 0;
      m_lookahead_pos = 0;
      m_fill_lookahead_pos = 0;
      m_fill_lookahead_size = 0;
      m_fill_dict_size = 0;
      m_num_completed_helper_threads = 0;

      if (!m_dict.try_resize_no_construct(max_dict_size + CLZBase::cMaxMatchLen))
         return false;

      if (!m_hash.try_resize_no_construct(cHashSize))
         return false;

      if (!m_nodes.try_resize_no_construct(max_dict_size))
         return false;

      memset(m_hash.get_ptr(), 0, m_hash.size_in_bytes());

      return true;
   }